

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SampleMaskCase::iterate(SampleMaskCase *this)

{
  ostringstream *poVar1;
  QueryType QVar2;
  RenderContext *context;
  long lVar3;
  int iVar4;
  uint uVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *pTVar8;
  uint uVar9;
  ulong uVar10;
  Surface *pSVar11;
  char *pcVar12;
  ulong uVar13;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  IterateResult IVar14;
  uint uVar15;
  int iVar16;
  int x_1;
  undefined4 uVar17;
  int x;
  int iVar18;
  int wordNdx;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  allocator<char> local_4de;
  allocator<char> local_4dd;
  allocator<char> local_4dc;
  allocator<char> local_4db;
  allocator<char> local_4da;
  allocator<char> local_4d9;
  ScopedLogSection section;
  vector<unsigned_int,_std::allocator<unsigned_int>_> totalBitmask;
  Surface errorMask;
  Surface result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> effectiveMask;
  Buffer vertexBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bitmask;
  MessageBuilder local_1b0;
  long lVar7;
  
  pTVar8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Iteration",(allocator<char> *)&effectiveMask);
  iVar4 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4);
  if (iVar4 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertexBuffer,"Verifying with zero mask",(allocator<char> *)&local_3a0);
  }
  else {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    local_340._M_string_length = 0;
    local_340.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_320,&local_340,"Verifying sample ");
    bitmask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) + 1;
    de::toString<int>(&local_360,(int *)&bitmask);
    std::operator+(&local_300,&local_320,&local_360);
    std::operator+(&local_3a0,&local_300,"/");
    de::toString<int>(&local_380,(int *)&this->m_verifierType);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &vertexBuffer,&local_3a0,&local_380);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar8,(string *)&local_1b0,(string *)&vertexBuffer);
  std::__cxx11::string::~string((string *)&vertexBuffer);
  if (iVar4 != -1) {
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
  }
  std::__cxx11::string::~string((string *)&local_1b0);
  uVar5 = *(uint *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar7 + 0x78))
            (0x8d40,*(undefined4 *)
                     &this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2);
  iVar4 = this->m_maxSampleMaskWords;
  (**(code **)(lVar7 + 0x1a00))(0,0,iVar4);
  (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Clearing image");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar7 + 0x188))(0x4000);
  if (((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 4) == 0) {
    genSetNthBitSampleMask(&bitmask,uVar5);
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Setting sample mask to 0b");
    (anonymous_namespace)::sampleMaskToString_abi_cxx11_
              ((string *)&vertexBuffer,(_anonymous_namespace_ *)&bitmask,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)this->m_verifierType,
               iVar4);
    std::operator<<((ostream *)poVar1,(string *)&vertexBuffer);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&vertexBuffer);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    (**(code **)(lVar7 + 0x5e0))(0x8e51);
    for (uVar19 = 0;
        (long)uVar19 <
        (long)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                      4); uVar19 = uVar19 + 1) {
      uVar17 = 0;
      if ((long)uVar19 <
          (long)(int)((ulong)((long)bitmask.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             CONCAT44(bitmask.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)bitmask.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start)) >> 2)) {
        uVar17 = *(undefined4 *)
                  (CONCAT44(bitmask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)bitmask.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) + uVar19 * 4);
      }
      (**(code **)(lVar7 + 0x1258))(uVar19 & 0xffffffff,uVar17);
    }
  }
  else {
    genSetNthBitSampleMask(&bitmask,uVar5);
    QVar2 = this->m_verifierType;
    uVar19 = (long)(int)(QVar2 - QUERY_BOOLEAN_VEC4) / 0x20;
    iVar4 = (int)uVar19;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&effectiveMask,(long)(iVar4 + 1),(allocator_type *)&local_1b0);
    uVar10 = 0;
    uVar13 = 0;
    if (0 < iVar4) {
      uVar13 = uVar19 & 0xffffffff;
    }
    for (; uVar13 != uVar10; uVar10 = uVar10 + 1) {
      effectiveMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10] = 0xffffffff;
    }
    effectiveMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[iVar4] =
         ~(uint)(-1L << ((char)QVar2 + (char)uVar19 * -0x20 & 0x3fU));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&totalBitmask,
               (long)effectiveMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)effectiveMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_1b0);
    uVar10 = (ulong)((long)effectiveMask.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)effectiveMask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar19 = CONCAT44(bitmask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                      (int)bitmask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    lVar3 = CONCAT44(totalBitmask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     (int)totalBitmask.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar15 = 0;
    uVar13 = uVar10 & 0xffffffff;
    if ((int)uVar10 < 1) {
      uVar13 = 0;
    }
    uVar10 = uVar19;
    for (uVar20 = 0; iVar4 = (int)uVar10, uVar13 != uVar20; uVar20 = uVar20 + 1) {
      dVar6 = deUint32Hash(uVar15 ^ uVar5);
      uVar9 = 0;
      if ((long)uVar20 <
          (long)(int)((long)bitmask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish - uVar19 >> 2)) {
        uVar9 = *(uint *)(uVar19 + uVar20 * 4);
      }
      uVar9 = (uVar9 ^ dVar6) &
              effectiveMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20] ^ dVar6;
      uVar10 = (ulong)uVar9;
      *(uint *)(lVar3 + uVar20 * 4) = uVar9;
      uVar15 = uVar15 + 4;
    }
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Setting sample mask to 0b");
    (anonymous_namespace)::sampleMaskToString_abi_cxx11_
              ((string *)&vertexBuffer,(_anonymous_namespace_ *)&totalBitmask,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               (ulong)(((int)totalBitmask.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                        (int)totalBitmask.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start & 0x1ffffffcU) << 3),iVar4);
    std::operator<<((ostream *)poVar1,(string *)&vertexBuffer);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&vertexBuffer);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    (**(code **)(lVar7 + 0x5e0))(0x8e51);
    for (uVar19 = 0;
        (long)uVar19 <
        (long)*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                      4); uVar19 = uVar19 + 1) {
      uVar17 = 0;
      if ((long)uVar19 <
          (long)(int)((ulong)(CONCAT44(totalBitmask.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       (int)totalBitmask.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish) -
                             CONCAT44(totalBitmask.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)totalBitmask.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start)) >> 2)) {
        uVar17 = *(undefined4 *)
                  (CONCAT44(totalBitmask.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)totalBitmask.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) + uVar19 * 4);
      }
      (**(code **)(lVar7 + 0x1258))(uVar19 & 0xffffffff,uVar17);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&totalBitmask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&effectiveMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&bitmask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  uVar5 = *(uint *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  if ((uVar5 & 1) != 0) {
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Enabling alpha to coverage.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    (**(code **)(lVar7 + 0x5e0))(0x809e);
    uVar5 = *(uint *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  }
  if ((uVar5 & 2) != 0) {
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Enabling sample coverage. Varying sample coverage for grid cells.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    (**(code **)(lVar7 + 0x5e0))(0x80a0);
  }
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Drawing test grid");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar7 + 0xd8))
            ((int)this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length);
  (**(code **)(lVar7 + 0x40))
            (0x8892,*(undefined4 *)
                     ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                             _M_string_length + 4));
  (**(code **)(lVar7 + 0x19f0))
            (*(undefined4 *)
              ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 + 8
              ),4,0x1406,0,0,0);
  (**(code **)(lVar7 + 0x610))
            (*(undefined4 *)
              ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 + 8
              ));
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"vertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x398);
  (**(code **)(lVar7 + 0x1680))
            (*(undefined4 *)
              (this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2.
               _M_allocated_capacity + 0x98));
  iVar4 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
  for (iVar16 = 0; iVar16 < iVar4; iVar16 = iVar16 + 1) {
    for (iVar18 = 0; iVar18 < iVar4; iVar18 = iVar18 + 1) {
      if (((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 2) != 0) {
        (**(code **)(lVar7 + 0x1250))((float)(iVar16 * iVar4 + iVar18) / (float)(iVar4 * iVar4),0);
        iVar4 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
      }
      (**(code **)(lVar7 + 0x538))(4,(iVar4 * iVar16 + iVar18) * 6,6);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"drawArrays",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x3a3);
      iVar4 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
    }
  }
  (**(code **)(lVar7 + 0x518))
            (*(undefined4 *)
              ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 + 8
              ));
  (**(code **)(lVar7 + 0x1680))(0);
  (**(code **)(lVar7 + 0x78))(0x8d40,0);
  (**(code **)(lVar7 + 0x4e8))(0x8e51);
  (**(code **)(lVar7 + 0x4e8))(0x809e);
  (**(code **)(lVar7 + 0x4e8))(0x80a0);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x3ae);
  iVar4 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4);
  tcu::Surface::Surface(&result,this->m_maxSampleMaskWords,this->m_maxSampleMaskWords);
  tcu::Surface::Surface(&errorMask,this->m_maxSampleMaskWords,this->m_maxSampleMaskWords);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&errorMask);
  bitmask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&bitmask);
  tcu::clear((PixelBufferAccess *)&local_1b0,(Vec4 *)&vertexBuffer);
  if ((anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad == '\0')
  {
    iVar16 = __cxa_guard_acquire(&(anonymous_namespace)::SampleMaskCase::
                                  drawSample(tcu::Surface&,int)::fullscreenQuad);
    if (iVar16 != 0) {
      (anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad._0_8_ =
           0x3f800000bf800000;
      (anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad._8_8_ =
           0x3f80000000000000;
      (anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad._16_8_ =
           0xbf800000bf800000;
      (anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad._24_8_ =
           0x3f80000000000000;
      (anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad._32_8_ =
           0x3f8000003f800000;
      (anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad._40_8_ =
           0x3f80000000000000;
      (anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad._48_4_ =
           0x3f800000;
      (anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad._52_4_ =
           0xbf800000;
      (anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad._56_4_ =
           0;
      (anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad._60_4_ =
           0x3f800000;
      __cxa_guard_release(&(anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::
                           fullscreenQuad);
    }
  }
  iVar16 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var_00,iVar16);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&vertexBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  (**(code **)(lVar7 + 0xb8))
            (0x9100,*(undefined4 *)
                     ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus
                             ._M_p + 4));
  (**(code **)(lVar7 + 0xd8))
            ((int)this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length);
  (**(code **)(lVar7 + 0x40))(0x8892,vertexBuffer.super_ObjectWrapper.m_object);
  (**(code **)(lVar7 + 0x150))
            (0x8892,0x40,
             (anonymous_namespace)::SampleMaskCase::drawSample(tcu::Surface&,int)::fullscreenQuad,
             0x88e4);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"bufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x3f9);
  (**(code **)(lVar7 + 0x1a00))(0,0,this->m_maxSampleMaskWords);
  (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar7 + 0x188))(0x4000);
  (**(code **)(lVar7 + 0x19f0))
            (*(undefined4 *)
              &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p,4
             ,0x1406,0,0,0);
  (**(code **)(lVar7 + 0x610))
            (*(undefined4 *)
              &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"vertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x400);
  (**(code **)(lVar7 + 0x1680))
            (*(undefined4 *)
              (*(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2
                        + 8) + 0x98));
  (**(code **)(lVar7 + 0x14f0))
            (*(undefined4 *)
              ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus
                      ._M_p + 4),0);
  (**(code **)(lVar7 + 0x14f0))
            ((int)this[1].super_TestCase.super_TestCase.super_TestNode.m_description.
                  _M_string_length,iVar4);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"useprogram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x405);
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Reading from texture with sampler shader, u_sample = ");
  std::ostream::operator<<(poVar1,iVar4);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar7 + 0x538))(5,0,4);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x40a);
  (**(code **)(lVar7 + 0x518))
            (*(undefined4 *)
              &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p);
  (**(code **)(lVar7 + 0x1680))(0);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"cleanup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x40e);
  (**(code **)(lVar7 + 0x648))();
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&result);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&local_1b0);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x412);
  glu::ObjectWrapper::~ObjectWrapper(&vertexBuffer.super_ObjectWrapper);
  uVar19 = (ulong)(uint)this->m_maxSampleMaskWords;
  bVar21 = false;
  for (iVar16 = 0; iVar16 < (int)uVar19; iVar16 = iVar16 + 1) {
    for (iVar18 = 0; iVar18 < (int)uVar19; iVar18 = iVar18 + 1) {
      uVar5 = *(uint *)((long)result.m_pixels.m_ptr + (long)(result.m_width * iVar16 + iVar18) * 4);
      if (((uVar5 & 0xff00) != 0) ||
         ((((char)uVar5 != -1 && (iVar4 != -1)) &&
          (((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 3) == 0)))) {
        *(undefined4 *)
         ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar16 + iVar18) * 4) =
             0xff0000ff;
        uVar19 = (ulong)(uint)this->m_maxSampleMaskWords;
        bVar21 = true;
      }
    }
  }
  if (bVar21) {
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,"Image verification failed, disabled samples found."
                   );
    pTVar8 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&totalBitmask,"VerificationResult",&local_4d9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"Result of rendering",&local_4da);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&effectiveMask,(string *)&totalBitmask,&local_260);
    iVar4 = (int)pTVar8;
    tcu::LogImageSet::write((LogImageSet *)&effectiveMask,iVar4,__buf,uVar19);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"Result",&local_4db);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Result",&local_4dc);
    pSVar11 = &result;
    tcu::LogImage::LogImage
              ((LogImage *)&vertexBuffer,&local_280,&local_2a0,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&vertexBuffer,iVar4,__buf_00,(size_t)pSVar11);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"ErrorMask",&local_4dd);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"Error Mask",&local_4de)
    ;
    pSVar11 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&bitmask,&local_2c0,&local_2e0,pSVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&bitmask,iVar4,__buf_01,(size_t)pSVar11);
    tcu::TestLog::endImageSet(pTVar8);
    tcu::LogImage::~LogImage((LogImage *)&bitmask);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
    tcu::LogImage::~LogImage((LogImage *)&vertexBuffer);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&effectiveMask);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&totalBitmask);
  }
  else {
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,"Image verification ok, no disabled samples found.")
    ;
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&result);
  if (bVar21) {
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0
    ;
  }
  iVar4 = *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) + 1;
  *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4) = iVar4;
  if (iVar4 < (int)this->m_verifierType) {
    IVar14 = CONTINUE;
  }
  else {
    pcVar12 = "Unused mask bits have effect";
    if (((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 4) == 0) {
      pcVar12 = "Sample test failed";
    }
    bVar21 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p
             == 0;
    description = "Pass";
    if (bVar21) {
      description = pcVar12;
    }
    IVar14 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar21,
               description);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return IVar14;
}

Assistant:

SampleMaskCase::IterateResult SampleMaskCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// initial values
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int ndx = 0; ndx < m_maxSampleMaskWords; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_SAMPLE_MASK_VALUE, ndx, -1, m_verifierType);
	}

	// fixed values
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "fixed", "Fixed values");

		for (int ndx = 0; ndx < m_maxSampleMaskWords; ++ndx)
		{
			gl.glSampleMaski(ndx, 0);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "glSampleMaski");

			verifyStateIndexedInteger(result, gl, GL_SAMPLE_MASK_VALUE, ndx, 0, m_verifierType);
		}
	}

	// random masks
	{
		const int					numRandomTest	= 20;
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "random", "Random values");
		de::Random					rnd				(0x4312);

		for (int testNdx = 0; testNdx < numRandomTest; ++testNdx)
		{
			const glw::GLint	maskIndex		= (glw::GLint)(rnd.getUint32() % m_maxSampleMaskWords);
			glw::GLint			mask			= (glw::GLint)(rnd.getUint32());

			gl.glSampleMaski(maskIndex, mask);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "glSampleMaski");

			verifyStateIndexedInteger(result, gl, GL_SAMPLE_MASK_VALUE, maskIndex, mask, m_verifierType);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}